

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O0

void __thiscall vector_bagwell<int,_16U>::push_back(vector_bagwell<int,_16U> *this,int *t)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  int *t_local;
  vector_bagwell<int,_16U> *this_local;
  
  bVar2 = current_block_full(this);
  if (bVar2) {
    sVar3 = std::vector<int_*,_std::allocator<int_*>_>::size(&this->_index_block);
    this->_left_in_block = (ulong)(uint)(0x10 << ((byte)sVar3 & 0x1f));
    piVar4 = (int *)malloc(this->_left_in_block << 2);
    this->_insertpos = piVar4;
    std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->_index_block,&this->_insertpos);
  }
  iVar1 = *t;
  piVar4 = this->_insertpos;
  this->_insertpos = piVar4 + 1;
  *piVar4 = iVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}